

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::ArgumentParser::ArgumentParser(ArgumentParser *this,string *description_,string *epilog_)

{
  allocator local_71;
  string local_70;
  code *local_50 [2];
  code *local_40;
  code *local_38;
  
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  local_50[1] = (code *)0x0;
  local_50[0] = Group::Validators::AllChildGroups;
  local_38 = std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
             _M_invoke;
  local_40 = std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
             _M_manager;
  Group::Group(&this->super_Group,&local_70,(function<bool_(const_args::Group_&)> *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  std::__cxx11::string::~string((string *)&local_70);
  (this->super_Group).super_Base._vptr_Base = (_func_int **)&PTR__ArgumentParser_00136288;
  (this->prog)._M_dataplus._M_p = (pointer)&(this->prog).field_2;
  (this->prog)._M_string_length = 0;
  (this->prog).field_2._M_local_buf[0] = '\0';
  (this->proglinePostfix)._M_dataplus._M_p = (pointer)&(this->proglinePostfix).field_2;
  (this->proglinePostfix)._M_string_length = 0;
  (this->proglinePostfix).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->description,(string *)description_);
  std::__cxx11::string::string((string *)&this->epilog,(string *)epilog_);
  std::__cxx11::string::string((string *)&this->longprefix,"--",(allocator *)&local_70);
  std::__cxx11::string::string((string *)&this->shortprefix,"-",(allocator *)&local_70);
  std::__cxx11::string::string((string *)&this->longseparator,"=",(allocator *)&local_70);
  std::__cxx11::string::string((string *)&this->terminator,"--",(allocator *)&local_70);
  this->allowJoinedShortValue = true;
  this->allowJoinedLongValue = true;
  this->allowSeparateShortValue = true;
  this->allowSeparateLongValue = true;
  HelpParams::HelpParams(&this->helpParams);
  return;
}

Assistant:

ArgumentParser(const std::string &description_, const std::string &epilog_ = std::string()) :
                Group("", Group::Validators::AllChildGroups),
                description(description_),
                epilog(epilog_),
                longprefix("--"),
                shortprefix("-"),
                longseparator("="),
                terminator("--"),
                allowJoinedShortValue(true),
                allowJoinedLongValue(true),
                allowSeparateShortValue(true),
                allowSeparateLongValue(true) {}